

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

const_iterator
anon_unknown.dwarf_18c225::findByNameOrAlias<VulkanHppGenerator::StructureData>
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
           *values,string *name)

{
  _Base_ptr __n;
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
          ::find(&values->_M_t,name);
  cVar4 = cVar2;
  if ((_Rb_tree_header *)cVar2._M_node == &(values->_M_t)._M_impl.super__Rb_tree_header) {
    for (cVar4._M_node = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (cVar4._M_node != cVar2._M_node &&
        (((__n = cVar4._M_node[1]._M_parent, __n != (_Base_ptr)name->_M_string_length ||
          ((__n != (_Base_ptr)0x0 &&
           (iVar1 = bcmp(*(void **)(cVar4._M_node + 1),(name->_M_dataplus)._M_p,(size_t)__n),
           iVar1 != 0)))) &&
         (cVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)(cVar4._M_node + 2),name),
         cVar3._M_node == (_Base_ptr)&cVar4._M_node[2]._M_parent))));
        cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node)) {
    }
  }
  return (const_iterator)cVar4._M_node;
}

Assistant:

typename std::map<std::string, T>::const_iterator findByNameOrAlias( std::map<std::string, T> const & values, std::string const & name )
  {
    auto it = values.find( name );
    if ( it == values.end() )
    {
      it = std::ranges::find_if( values, [&name]( auto const & value ) { return ( value.first == name ) || value.second.aliases.contains( name ); } );
    }
    return it;
  }